

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O2

CSHA1 * __thiscall CSHA1::Write(CSHA1 *this,uchar *data,size_t len)

{
  uchar *puVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = data + len;
  uVar3 = this->bytes & 0x3f;
  if (uVar3 != 0) {
    if (len + uVar3 < 0x40) goto LAB_00b2f559;
    sVar4 = 0x40 - uVar3;
    memcpy(this->buf + uVar3,data,sVar4);
    this->bytes = this->bytes + sVar4;
    data = data + sVar4;
    anon_unknown.dwarf_41d636e::sha1::Transform(this->s,this->buf);
  }
  uVar3 = 0;
LAB_00b2f559:
  for (sVar4 = (long)puVar1 - (long)data; 0x3f < (long)sVar4; sVar4 = sVar4 - 0x40) {
    anon_unknown.dwarf_41d636e::sha1::Transform(this->s,data);
    this->bytes = this->bytes + 0x40;
    data = data + 0x40;
  }
  if (data < puVar1) {
    memcpy(this->buf + uVar3,data,sVar4);
    this->bytes = this->bytes + sVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

CSHA1& CSHA1::Write(const unsigned char* data, size_t len)
{
    const unsigned char* end = data + len;
    size_t bufsize = bytes % 64;
    if (bufsize && bufsize + len >= 64) {
        // Fill the buffer, and process it.
        memcpy(buf + bufsize, data, 64 - bufsize);
        bytes += 64 - bufsize;
        data += 64 - bufsize;
        sha1::Transform(s, buf);
        bufsize = 0;
    }
    while (end - data >= 64) {
        // Process full chunks directly from the source.
        sha1::Transform(s, data);
        bytes += 64;
        data += 64;
    }
    if (end > data) {
        // Fill the buffer with what remains.
        memcpy(buf + bufsize, data, end - data);
        bytes += end - data;
    }
    return *this;
}